

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_stream_init_single
              (cubeb_conflict1 *ctx,cubeb_stream_conflict1 **stream,char *stream_name,
              snd_pcm_stream_t stream_type,cubeb_devid deviceid,cubeb_stream_params *stream_params,
              uint latency_frames,cubeb_data_callback_conflict1 data_callback,
              cubeb_state_callback_conflict1 state_callback,void *user_ptr)

{
  int iVar1;
  char *pcm_name_00;
  size_t __size;
  void *pvVar2;
  undefined4 in_ECX;
  undefined8 *in_RSI;
  long in_RDI;
  char *in_R8;
  uint *in_R9;
  uint in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int min_latency;
  char *pcm_name;
  int latency_us;
  snd_pcm_uframes_t period_size;
  snd_pcm_format_t format;
  int r;
  cubeb_stream_conflict1 *stm;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  snd_pcm_stream_t in_stack_ffffffffffffff84;
  snd_pcm_stream_t local_54;
  snd_pcm_uframes_t local_50;
  snd_pcm_format_t local_48;
  int local_44;
  long *local_40;
  uint *local_38;
  undefined4 local_24;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  if ((snd_pcm_t **)in_R8 == (snd_pcm_t **)0x0) {
    in_R8 = "default";
  }
  if ((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) {
    __assert_fail("ctx && stream",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x3e5,
                  "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                 );
  }
  *in_RSI = 0;
  if ((in_R9[4] & 1) == 0) {
    pcm_name_00 = (char *)(ulong)*in_R9;
    switch(pcm_name_00) {
    case (char *)0x0:
      local_48 = SND_PCM_FORMAT_S16;
      break;
    case (char *)0x1:
      local_48 = SND_PCM_FORMAT_S16_BE;
      break;
    case (char *)0x2:
      local_48 = SND_PCM_FORMAT_FLOAT;
      break;
    case (char *)0x3:
      local_48 = SND_PCM_FORMAT_FLOAT_BE;
      break;
    default:
      return -2;
    }
    local_38 = in_R9;
    local_24 = in_ECX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
    if (*(uint *)(local_10 + 0xe0) < 0x10) {
      *(int *)(local_10 + 0xe0) = *(int *)(local_10 + 0xe0) + 1;
      pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 0x18));
      local_40 = (long *)calloc(1,0x118);
      if (local_40 == (long *)0x0) {
        __assert_fail("stm",
                      "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                      ,0x407,
                      "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                     );
      }
      *local_40 = local_10;
      local_40[8] = in_stack_00000010;
      local_40[9] = in_stack_00000018;
      local_40[1] = in_stack_00000020;
      local_40[0xd] = *(long *)local_38;
      local_40[0xe] = *(long *)(local_38 + 2);
      *(uint *)(local_40 + 0xf) = local_38[4];
      *(undefined4 *)(local_40 + 0x16) = 0;
      *(undefined4 *)(local_40 + 0x1e) = 0x3f800000;
      local_40[0x1f] = 0;
      local_40[0x20] = 0;
      *(undefined4 *)(local_40 + 0x21) = local_24;
      local_40[0x22] = 0;
      local_44 = pthread_mutex_init((pthread_mutex_t *)(local_40 + 2),(pthread_mutexattr_t *)0x0);
      if (local_44 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                      ,0x416,
                      "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                     );
      }
      local_44 = pthread_cond_init((pthread_cond_t *)(local_40 + 0x10),(pthread_condattr_t *)0x0);
      if (local_44 != 0) {
        __assert_fail("r == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                      ,0x419,
                      "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                     );
      }
      local_44 = alsa_locked_pcm_open
                           ((snd_pcm_t **)in_R8,pcm_name_00,in_stack_ffffffffffffff84,
                            (snd_config_t *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (local_44 < 0) {
        alsa_stream_destroy((cubeb_stream_conflict1 *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        local_4 = -1;
      }
      else {
        local_44 = (*cubeb_snd_pcm_nonblock)((snd_pcm_t *)local_40[7],1);
        if (local_44 != 0) {
          __assert_fail("r == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                        ,0x423,
                        "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                       );
        }
        local_54 = (snd_pcm_stream_t)
                   (((double)in_stack_00000008 * 1000000.0) /
                   (double)*(uint *)((long)local_40 + 0x6c));
        if (((*(long *)(local_10 + 0xe8) == 0) && (*(int *)(local_10 + 0xf0) != 0)) &&
           (in_stack_ffffffffffffff84 = local_54, (int)local_54 < 500000)) {
          local_54 = 500000;
          in_stack_ffffffffffffff84 = local_54;
        }
        local_44 = (*cubeb_snd_pcm_set_params)
                             ((snd_pcm_t *)local_40[7],local_48,SND_PCM_ACCESS_RW_INTERLEAVED,
                              *(uint *)(local_40 + 0xe),*(uint *)((long)local_40 + 0x6c),1,local_54)
        ;
        if (local_44 < 0) {
          alsa_stream_destroy((cubeb_stream_conflict1 *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          local_4 = -2;
        }
        else {
          local_44 = (*cubeb_snd_pcm_get_params)
                               ((snd_pcm_t *)local_40[7],(snd_pcm_uframes_t *)(local_40 + 0xc),
                                &local_50);
          if (local_44 != 0) {
            __assert_fail("r == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                          ,0x438,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          local_40[0xc] = local_40[0xc] << 1;
          __size = (*cubeb_snd_pcm_frames_to_bytes)((snd_pcm_t *)local_40[7],local_40[0xc]);
          pvVar2 = calloc(1,__size);
          local_40[0x1f] = (long)pvVar2;
          if (local_40[0x1f] == 0) {
            __assert_fail("stm->buffer",
                          "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                          ,0x43f,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          iVar1 = (*cubeb_snd_pcm_poll_descriptors_count)((snd_pcm_t *)local_40[7]);
          local_40[0x19] = (long)iVar1;
          if (local_40[0x19] == 0) {
            __assert_fail("stm->nfds > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                          ,0x442,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          pvVar2 = calloc(local_40[0x19],8);
          local_40[0x17] = (long)pvVar2;
          if (local_40[0x17] == 0) {
            __assert_fail("stm->saved_fds",
                          "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                          ,0x445,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          local_44 = (*cubeb_snd_pcm_poll_descriptors)
                               ((snd_pcm_t *)local_40[7],(pollfd *)local_40[0x17],
                                (uint)local_40[0x19]);
          if ((long)local_44 != local_40[0x19]) {
            __assert_fail("(nfds_t)r == stm->nfds",
                          "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                          ,0x447,
                          "int alsa_stream_init_single(cubeb *, cubeb_stream **, const char *, snd_pcm_stream_t, cubeb_devid, cubeb_stream_params *, unsigned int, cubeb_data_callback, cubeb_state_callback, void *)"
                         );
          }
          iVar1 = alsa_register_stream
                            ((cubeb_conflict1 *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (cubeb_stream_conflict1 *)CONCAT44(in_stack_ffffffffffffff7c,local_54))
          ;
          if (iVar1 == 0) {
            *local_18 = local_40;
            local_4 = 0;
          }
          else {
            alsa_stream_destroy((cubeb_stream_conflict1 *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
            local_4 = -1;
          }
        }
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)(local_10 + 0x18));
      local_4 = -1;
    }
  }
  else {
    local_4 = -4;
  }
  return local_4;
}

Assistant:

static int
alsa_stream_init_single(cubeb * ctx, cubeb_stream ** stream,
                        char const * stream_name, snd_pcm_stream_t stream_type,
                        cubeb_devid deviceid,
                        cubeb_stream_params * stream_params,
                        unsigned int latency_frames,
                        cubeb_data_callback data_callback,
                        cubeb_state_callback state_callback, void * user_ptr)
{
  (void)stream_name;
  cubeb_stream * stm;
  int r;
  snd_pcm_format_t format;
  snd_pcm_uframes_t period_size;
  int latency_us = 0;
  char const * pcm_name =
      deviceid ? (char const *)deviceid : CUBEB_ALSA_PCM_NAME;

  assert(ctx && stream);

  *stream = NULL;

  if (stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  switch (stream_params->format) {
  case CUBEB_SAMPLE_S16LE:
    format = SND_PCM_FORMAT_S16_LE;
    break;
  case CUBEB_SAMPLE_S16BE:
    format = SND_PCM_FORMAT_S16_BE;
    break;
  case CUBEB_SAMPLE_FLOAT32LE:
    format = SND_PCM_FORMAT_FLOAT_LE;
    break;
  case CUBEB_SAMPLE_FLOAT32BE:
    format = SND_PCM_FORMAT_FLOAT_BE;
    break;
  default:
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  pthread_mutex_lock(&ctx->mutex);
  if (ctx->active_streams >= CUBEB_STREAM_MAX) {
    pthread_mutex_unlock(&ctx->mutex);
    return CUBEB_ERROR;
  }
  ctx->active_streams += 1;
  pthread_mutex_unlock(&ctx->mutex);

  stm = calloc(1, sizeof(*stm));
  assert(stm);

  stm->context = ctx;
  stm->data_callback = data_callback;
  stm->state_callback = state_callback;
  stm->user_ptr = user_ptr;
  stm->params = *stream_params;
  stm->state = INACTIVE;
  stm->volume = 1.0;
  stm->buffer = NULL;
  stm->bufframes = 0;
  stm->stream_type = stream_type;
  stm->other_stream = NULL;

  r = pthread_mutex_init(&stm->mutex, NULL);
  assert(r == 0);

  r = pthread_cond_init(&stm->cond, NULL);
  assert(r == 0);

  r = alsa_locked_pcm_open(&stm->pcm, pcm_name, stm->stream_type,
                           ctx->local_config);
  if (r < 0) {
    alsa_stream_destroy(stm);
    return CUBEB_ERROR;
  }

  r = WRAP(snd_pcm_nonblock)(stm->pcm, 1);
  assert(r == 0);

  latency_us = latency_frames * 1e6 / stm->params.rate;

  /* Ugly hack: the PA ALSA plugin allows buffer configurations that can't
     possibly work.  See https://bugzilla.mozilla.org/show_bug.cgi?id=761274.
     Only resort to this hack if the handle_underrun workaround failed. */
  if (!ctx->local_config && ctx->is_pa) {
    const int min_latency = 5e5;
    latency_us = latency_us < min_latency ? min_latency : latency_us;
  }

  r = WRAP(snd_pcm_set_params)(stm->pcm, format, SND_PCM_ACCESS_RW_INTERLEAVED,
                               stm->params.channels, stm->params.rate, 1,
                               latency_us);
  if (r < 0) {
    alsa_stream_destroy(stm);
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  r = WRAP(snd_pcm_get_params)(stm->pcm, &stm->buffer_size, &period_size);
  assert(r == 0);

  /* Double internal buffer size to have enough space when waiting for the other
   * side of duplex connection */
  stm->buffer_size *= 2;
  stm->buffer =
      calloc(1, WRAP(snd_pcm_frames_to_bytes)(stm->pcm, stm->buffer_size));
  assert(stm->buffer);

  stm->nfds = WRAP(snd_pcm_poll_descriptors_count)(stm->pcm);
  assert(stm->nfds > 0);

  stm->saved_fds = calloc(stm->nfds, sizeof(struct pollfd));
  assert(stm->saved_fds);
  r = WRAP(snd_pcm_poll_descriptors)(stm->pcm, stm->saved_fds, stm->nfds);
  assert((nfds_t)r == stm->nfds);

  if (alsa_register_stream(ctx, stm) != 0) {
    alsa_stream_destroy(stm);
    return CUBEB_ERROR;
  }

  *stream = stm;

  return CUBEB_OK;
}